

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjCompressFromYUVPlanes
              (tjhandle handle,uchar **srcPlanes,int width,int *strides,int height,int subsamp,
              uchar **jpegBuf,unsigned_long *jpegSize,int jpegQual,int flags)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  JSAMPARRAY ppJVar6;
  int iVar7;
  uint alloc;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  unsigned_long uVar11;
  void *pvVar12;
  void *__ptr;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  size_t sVar17;
  uchar *puVar18;
  long lVar19;
  void *pvVar20;
  uint uVar21;
  tjinstance *this;
  char *__string;
  uint uVar22;
  uint uVar23;
  long lVar24;
  size_t __n;
  long *in_FS_OFFSET;
  bool bVar25;
  JSAMPROW *tmpbuf [10];
  JSAMPROW *inbuf [10];
  int iw [10];
  int th [10];
  int ph [10];
  int pw [10];
  JSAMPARRAY yuvptr [10];
  long local_1e8 [20];
  uint auStack_148 [12];
  uint auStack_118 [12];
  uint auStack_e8 [12];
  uint auStack_b8 [12];
  JSAMPARRAY local_88 [11];
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  local_1e8[8] = 0;
  local_1e8[9] = 0;
  local_1e8[6] = 0;
  local_1e8[7] = 0;
  local_1e8[4] = 0;
  local_1e8[5] = 0;
  local_1e8[2] = 0;
  local_1e8[3] = 0;
  local_1e8[0] = 0;
  local_1e8[1] = 0;
  local_1e8[10] = 0;
  local_1e8[0xb] = 0;
  local_1e8[0xc] = 0;
  local_1e8[0xd] = 0;
  local_1e8[0xe] = 0;
  local_1e8[0xf] = 0;
  local_1e8[0x10] = 0;
  local_1e8[0x11] = 0;
  local_1e8[0x12] = 0;
  local_1e8[0x13] = 0;
  if ((*(byte *)((long)handle + 0x600) & 1) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjCompressFromYUVPlanes(): Instance has not been initialized for compression",0x4d);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),
           "tjCompressFromYUVPlanes(): Instance has not been initialized for compression",0x4d);
  }
  else {
    if ((((((srcPlanes != (uchar **)0x0) && ((uint)jpegQual < 0x65)) &&
          (jpegSize != (unsigned_long *)0x0)) && ((jpegBuf != (uchar **)0x0 && ((uint)subsamp < 6)))
         ) && ((0 < height && ((0 < width && (*srcPlanes != (uchar *)0x0)))))) &&
       ((subsamp == 3 || ((srcPlanes[1] != (uchar *)0x0 && (srcPlanes[2] != (uchar *)0x0)))))) {
      iVar7 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar7 != 0) {
        alloc = 1;
        __ptr = (void *)0x0;
        uVar10 = 0xffffffff;
        goto LAB_0010dd4c;
      }
      *(int *)((long)handle + 0x30) = width;
      *(int *)((long)handle + 0x34) = height;
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          __string = "JSIMD_FORCESSE=1";
          goto LAB_0010de08;
        }
        if ((flags & 0x20U) != 0) {
          __string = "JSIMD_FORCESSE2=1";
          goto LAB_0010de08;
        }
      }
      else {
        __string = "JSIMD_FORCEMMX=1";
LAB_0010de08:
        putenv(__string);
      }
      bVar25 = ((uint)flags >> 10 & 1) == 0;
      if (!bVar25) {
        uVar11 = tjBufSize(width,height,subsamp);
        *jpegSize = uVar11;
      }
      alloc = (uint)bVar25;
      jpeg_mem_dest_tj((j_compress_ptr)handle,jpegBuf,jpegSize,alloc);
      __ptr = (void *)0x0;
      setCompDefaults((jpeg_compress_struct *)handle,0,subsamp,jpegQual,flags);
      *(undefined4 *)((long)handle + 0x100) = 1;
      jpeg_start_compress((j_compress_ptr)handle,1);
      iVar7 = *(int *)((long)handle + 0x4c);
      lVar24 = (long)iVar7;
      bVar25 = true;
      if (lVar24 < 1) {
LAB_0010e20c:
        iVar7 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
        if (iVar7 == 0) {
          if (0 < *(int *)((long)handle + 0x34)) {
            iVar7 = 0;
            do {
              iVar15 = *(int *)((long)handle + 0x4c);
              if (0 < iVar15) {
                lVar24 = 0;
                do {
                  uVar10 = (*(int *)(*(long *)((long)handle + 0x58) + 0xc + lVar24 * 0x60) * iVar7)
                           / *(int *)((long)handle + 0x13c);
                  lVar13 = (long)(int)uVar10;
                  if (bVar25) {
                    local_88[lVar24] = (JSAMPARRAY)(lVar13 * 8 + local_1e8[lVar24 + 10]);
                  }
                  else {
                    uVar2 = auStack_118[lVar24];
                    uVar8 = auStack_e8[lVar24];
                    uVar22 = uVar8 - uVar10;
                    uVar9 = uVar22;
                    if ((int)uVar2 < (int)uVar22) {
                      uVar9 = uVar2;
                    }
                    if (0 < (int)uVar9) {
                      lVar19 = local_1e8[lVar24];
                      uVar23 = auStack_b8[lVar24];
                      __n = (size_t)(int)uVar23;
                      uVar21 = auStack_148[lVar24];
                      lVar16 = local_1e8[lVar24 + 10];
                      uVar14 = 0;
                      do {
                        memcpy(*(void **)(lVar19 + uVar14 * 8),
                               *(void **)(lVar13 * 8 + lVar16 + uVar14 * 8),__n);
                        sVar17 = __n;
                        if ((int)uVar23 < (int)uVar21) {
                          do {
                            lVar5 = *(long *)(lVar19 + uVar14 * 8);
                            *(undefined1 *)(lVar5 + sVar17) = *(undefined1 *)(lVar5 + -1 + __n);
                            sVar17 = sVar17 + 1;
                          } while ((long)(int)uVar21 != sVar17);
                        }
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != uVar9);
                    }
                    ppJVar6 = (JSAMPARRAY)local_1e8[lVar24];
                    if ((int)uVar22 < (int)uVar2) {
                      uVar9 = auStack_148[lVar24];
                      lVar19 = 0;
                      do {
                        memcpy(ppJVar6[((int)uVar8 + lVar19) - lVar13],
                               ppJVar6[(int)(~uVar10 + uVar8)],(long)(int)uVar9);
                        lVar19 = lVar19 + 1;
                      } while ((uVar2 + uVar10) - uVar8 != (int)lVar19);
                    }
                    local_88[lVar24] = ppJVar6;
                    iVar15 = *(int *)((long)handle + 0x4c);
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 < iVar15);
              }
              jpeg_write_raw_data((j_compress_ptr)handle,local_88,
                                  *(int *)((long)handle + 0x13c) << 3);
              iVar7 = iVar7 + *(int *)((long)handle + 0x13c) * 8;
            } while (iVar7 < *(int *)((long)handle + 0x34));
          }
          jpeg_finish_compress((j_compress_ptr)handle);
          uVar10 = 0;
          goto LAB_0010dd4c;
        }
      }
      else {
        lVar13 = *(long *)((long)handle + 0x58);
        uVar10 = *(uint *)((long)handle + 0x138);
        iVar15 = *(int *)((long)handle + 0x30);
        iVar1 = *(int *)((long)handle + 0x34);
        uVar2 = *(uint *)((long)handle + 0x13c);
        lVar19 = 0;
        pvVar20 = __ptr;
        do {
          lVar16 = lVar19 * 0x60;
          uVar22 = *(int *)(lVar13 + 0x1c + lVar16) * 8;
          auStack_148[lVar19] = uVar22;
          iVar3 = *(int *)(lVar13 + 0x20 + lVar16);
          uVar8 = (*(int *)(lVar13 + 8 + lVar16) * (-uVar10 & (uVar10 + iVar15) - 1)) / uVar10;
          auStack_b8[lVar19] = uVar8;
          iVar4 = *(int *)(lVar13 + 0xc + lVar16);
          uVar9 = ((-uVar2 & (uVar2 + iVar1) - 1) * iVar4) / uVar2;
          auStack_e8[lVar19] = uVar9;
          if (iVar3 << 3 != uVar9 || uVar22 != uVar8) {
            __ptr = (void *)0x1;
          }
          uVar23 = iVar4 * 8;
          auStack_118[lVar19] = uVar23;
          pvVar12 = malloc((long)(int)uVar9 * 8);
          local_1e8[lVar19 + 10] = (long)pvVar12;
          if (pvVar12 == (void *)0x0) {
            builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
            builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
            builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
            builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
            builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
            builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
            *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
            *(undefined4 *)((long)handle + 0x6d0) = 1;
            *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
            in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
            in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
            in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
            in_FS_OFFSET[-0x17] = 0x726f6d654d203a29;
            in_FS_OFFSET[-0x1a] = 0x6572706d6f436a74;
            in_FS_OFFSET[-0x19] = 0x55596d6f72467373;
            __ptr = (void *)0x0;
            goto LAB_0010e21a;
          }
          if (0 < (int)uVar9) {
            puVar18 = srcPlanes[lVar19];
            lVar16 = 0;
            do {
              *(uchar **)((long)pvVar12 + lVar16 * 8) = puVar18;
              if ((strides == (int *)0x0) || (uVar21 = strides[lVar19], strides[lVar19] == 0)) {
                uVar21 = uVar8;
              }
              puVar18 = puVar18 + (int)uVar21;
              lVar16 = lVar16 + 1;
            } while (lVar16 < (int)uVar9);
          }
          uVar8 = (int)pvVar20 + uVar23 * uVar22;
          lVar19 = lVar19 + 1;
          pvVar20 = (void *)(ulong)uVar8;
        } while (lVar19 != lVar24);
        bVar25 = (int)__ptr == 0;
        if (bVar25) {
          __ptr = (void *)0x0;
          bVar25 = true;
          goto LAB_0010e20c;
        }
        __ptr = malloc((long)(int)uVar8);
        if (__ptr != (void *)0x0) {
          if (iVar7 < 1) {
            bVar25 = false;
          }
          else {
            lVar13 = 0;
            pvVar20 = __ptr;
            do {
              uVar10 = auStack_118[lVar13];
              pvVar12 = malloc((long)(int)uVar10 * 8);
              local_1e8[lVar13] = (long)pvVar12;
              if (pvVar12 == (void *)0x0) {
                builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
                builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
                builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
                builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
                builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
                builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
                *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
                *(undefined4 *)((long)handle + 0x6d0) = 1;
                *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
                in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
                in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
                in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
                in_FS_OFFSET[-0x17] = 0x726f6d654d203a29;
                in_FS_OFFSET[-0x1a] = 0x6572706d6f436a74;
                in_FS_OFFSET[-0x19] = 0x55596d6f72467373;
                goto LAB_0010e21a;
              }
              if (0 < (int)uVar10) {
                uVar2 = auStack_148[lVar13];
                lVar19 = 0;
                do {
                  *(void **)((long)pvVar12 + lVar19 * 8) = pvVar20;
                  pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar2);
                  lVar19 = lVar19 + 1;
                } while ((int)uVar10 != lVar19);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != lVar24);
          }
          goto LAB_0010e20c;
        }
        builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
        builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
        builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
        builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
        builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
        *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
        in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
        in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
        in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
        in_FS_OFFSET[-0x17] = 0x726f6d654d203a29;
        in_FS_OFFSET[-0x1a] = 0x6572706d6f436a74;
        in_FS_OFFSET[-0x19] = 0x55596d6f72467373;
        __ptr = (void *)0x0;
      }
LAB_0010e21a:
      uVar10 = 0xffffffff;
      goto LAB_0010dd4c;
    }
    builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
    builtin_strncpy((char *)((long)handle + 0x620),"): Inval",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb4),"nvalid a",8);
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xac),"rgument",8);
    in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
    in_FS_OFFSET[-0x17] = 0x6c61766e49203a29;
    in_FS_OFFSET[-0x1a] = 0x6572706d6f436a74;
    in_FS_OFFSET[-0x19] = 0x55596d6f72467373;
  }
  uVar10 = 0xffffffff;
  alloc = 1;
  __ptr = (void *)0x0;
LAB_0010dd4c:
  if (100 < *(int *)((long)handle + 0x24)) {
    if (alloc != 0) {
      (**(code **)(*(long *)((long)handle + 0x28) + 0x20))(handle);
    }
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  lVar24 = 0;
  do {
    free((void *)local_1e8[lVar24]);
    free((void *)local_1e8[lVar24 + 10]);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 10);
  free(__ptr);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar10;
}

Assistant:

DLLEXPORT int tjCompressFromYUVPlanes(tjhandle handle,
                                      const unsigned char **srcPlanes,
                                      int width, const int *strides,
                                      int height, int subsamp,
                                      unsigned char **jpegBuf,
                                      unsigned long *jpegSize, int jpegQual,
                                      int flags)
{
  int i, row, retval = 0, alloc = 1;
  int pw[MAX_COMPONENTS], ph[MAX_COMPONENTS], iw[MAX_COMPONENTS],
    tmpbufsize = 0, usetmpbuf = 0, th[MAX_COMPONENTS];
  JSAMPLE *_tmpbuf = NULL, *ptr;
  JSAMPROW *inbuf[MAX_COMPONENTS], *tmpbuf[MAX_COMPONENTS];

  GET_CINSTANCE(handle)
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  inbuf[i] = NULL;
  }

  if ((this->init & COMPRESS) == 0)
    THROW("tjCompressFromYUVPlanes(): Instance has not been initialized for compression");

  if (!srcPlanes || !srcPlanes[0] || width <= 0 || height <= 0 ||
      subsamp < 0 || subsamp >= NUMSUBOPT || jpegBuf == NULL ||
      jpegSize == NULL || jpegQual < 0 || jpegQual > 100)
    THROW("tjCompressFromYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!srcPlanes[1] || !srcPlanes[2]))
    THROW("tjCompressFromYUVPlanes(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_NOREALLOC) {
    alloc = 0;  *jpegSize = tjBufSize(width, height, subsamp);
  }
  jpeg_mem_dest_tj(cinfo, jpegBuf, jpegSize, alloc);
  setCompDefaults(cinfo, TJPF_RGB, subsamp, jpegQual, flags);
  cinfo->raw_data_in = TRUE;

  jpeg_start_compress(cinfo, TRUE);
  for (i = 0; i < cinfo->num_components; i++) {
    jpeg_component_info *compptr = &cinfo->comp_info[i];
    int ih;

    iw[i] = compptr->width_in_blocks * DCTSIZE;
    ih = compptr->height_in_blocks * DCTSIZE;
    pw[i] = PAD(cinfo->image_width, cinfo->max_h_samp_factor) *
            compptr->h_samp_factor / cinfo->max_h_samp_factor;
    ph[i] = PAD(cinfo->image_height, cinfo->max_v_samp_factor) *
            compptr->v_samp_factor / cinfo->max_v_samp_factor;
    if (iw[i] != pw[i] || ih != ph[i]) usetmpbuf = 1;
    th[i] = compptr->v_samp_factor * DCTSIZE;
    tmpbufsize += iw[i] * th[i];
    if ((inbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i])) == NULL)
      THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
    ptr = (JSAMPLE *)srcPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      inbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }
  if (usetmpbuf) {
    if ((_tmpbuf = (JSAMPLE *)malloc(sizeof(JSAMPLE) * tmpbufsize)) == NULL)
      THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
    ptr = _tmpbuf;
    for (i = 0; i < cinfo->num_components; i++) {
      if ((tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * th[i])) == NULL)
        THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
      for (row = 0; row < th[i]; row++) {
        tmpbuf[i][row] = ptr;
        ptr += iw[i];
      }
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < (int)cinfo->image_height;
       row += cinfo->max_v_samp_factor * DCTSIZE) {
    JSAMPARRAY yuvptr[MAX_COMPONENTS];
    int crow[MAX_COMPONENTS];

    for (i = 0; i < cinfo->num_components; i++) {
      jpeg_component_info *compptr = &cinfo->comp_info[i];

      crow[i] = row * compptr->v_samp_factor / cinfo->max_v_samp_factor;
      if (usetmpbuf) {
        int j, k;

        for (j = 0; j < MIN(th[i], ph[i] - crow[i]); j++) {
          memcpy(tmpbuf[i][j], inbuf[i][crow[i] + j], pw[i]);
          /* Duplicate last sample in row to fill out MCU */
          for (k = pw[i]; k < iw[i]; k++)
            tmpbuf[i][j][k] = tmpbuf[i][j][pw[i] - 1];
        }
        /* Duplicate last row to fill out MCU */
        for (j = ph[i] - crow[i]; j < th[i]; j++)
          memcpy(tmpbuf[i][j], tmpbuf[i][ph[i] - crow[i] - 1], iw[i]);
        yuvptr[i] = tmpbuf[i];
      } else
        yuvptr[i] = &inbuf[i][crow[i]];
    }
    jpeg_write_raw_data(cinfo, yuvptr, cinfo->max_v_samp_factor * DCTSIZE);
  }
  jpeg_finish_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(inbuf[i]);
  }
  free(_tmpbuf);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}